

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_import.cpp
# Opt level: O2

void __thiscall
ComponentImport_singleImportA_Test::ComponentImport_singleImportA_Test
          (ComponentImport_singleImportA_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00133a88;
  return;
}

Assistant:

TEST(ComponentImport, singleImportA)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"some-other-model.xml\">\n"
        "    <component component_ref=\"a_component_in_that_model\" name=\"component_in_this_model\"/>\n"
        "  </import>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr imp = libcellml::ImportSource::create();
    imp->setUrl("some-other-model.xml");

    libcellml::ComponentPtr importedComponent = libcellml::Component::create();

    EXPECT_EQ(importedComponent->importSource(), nullptr);

    importedComponent->setName("component_in_this_model");
    importedComponent->setSourceComponent(imp, "a_component_in_that_model");

    EXPECT_EQ(importedComponent->importSource(), imp);

    EXPECT_EQ(size_t(0), m->componentCount());
    m->addComponent(importedComponent);
    EXPECT_EQ(size_t(1), m->componentCount());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}